

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_4::Validator::CheckModule(Validator *this)

{
  Module *this_00;
  string_view name;
  pointer pTVar1;
  ModuleFieldMixin<(wabt::ModuleFieldType)2> *pMVar2;
  ModuleFieldMixin<(wabt::ModuleFieldType)0> *pMVar3;
  ModuleFieldMixin<(wabt::ModuleFieldType)10> *pMVar4;
  ModuleFieldMixin<(wabt::ModuleFieldType)3> *pMVar5;
  ModuleFieldMixin<(wabt::ModuleFieldType)9> *pMVar6;
  ModuleFieldMixin<(wabt::ModuleFieldType)6> *pMVar7;
  bool bVar8;
  TypeEntryKind TVar9;
  Index type_index;
  ExternalKind EVar10;
  Result RVar11;
  TypeModuleField *pTVar12;
  pointer pTVar13;
  FuncType *pFVar14;
  Type *pTVar15;
  size_type sVar16;
  Type *result_types;
  TypeMut *fields;
  ArrayType *pAVar17;
  pointer pIVar18;
  FuncImport *pFVar19;
  TableImport *pTVar20;
  MemoryImport *pMVar21;
  GlobalImport *pGVar22;
  TagImport *pTVar23;
  TableModuleField *pTVar24;
  MemoryModuleField *pMVar25;
  GlobalModuleField *pGVar26;
  ulong uVar27;
  const_reference ppTVar28;
  ExprListVector *this_01;
  reference this_02;
  size_type sVar29;
  FuncModuleField *pFVar30;
  Location *loc;
  const_reference pvVar31;
  Decls *this_03;
  reference ppVar32;
  reference pMVar33;
  DataSegmentModuleField *pDVar34;
  const_reference ppMVar35;
  const_iterator cVar36;
  TypeMut field_13;
  Location *local_b18;
  undefined1 local_a10 [8];
  ExprVisitor visitor_4;
  Type local_99c;
  uint local_994;
  Type TStack_990;
  Index memory_index;
  Type offset_type_1;
  DataSegmentModuleField *f_11;
  ModuleField *field_12;
  const_iterator __end2_11;
  const_iterator __begin2_11;
  ModuleFieldList *__range2_11;
  undefined1 local_8e8 [8];
  ExprVisitor visitor_3;
  pair<wabt::Type,_unsigned_int> *decl;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  Decls *__range4_1;
  Location *body_end;
  Location *body_start;
  FuncModuleField *f_10;
  ModuleField *field_11;
  const_iterator __end2_10;
  const_iterator __begin2_10;
  ModuleFieldList *__range2_10;
  Index func_index;
  undefined1 local_7e0 [8];
  ExprVisitor visitor_2;
  intrusive_list<wabt::Expr> *elem_expr;
  const_iterator __end4;
  const_iterator __begin4;
  ExprListVector *__range4;
  undefined1 local_740 [8];
  ExprVisitor visitor_1;
  Type local_6c8;
  uint local_6c0;
  Type TStack_6bc;
  Index table_index;
  Type offset_type;
  Var local_6a8;
  Enum local_65c;
  ElemSegmentModuleField *local_658;
  ElemSegmentModuleField *f_9;
  ModuleField *field_10;
  intrusive_list<wabt::ModuleField> *local_640;
  undefined1 local_638 [8];
  const_iterator __end2_9;
  const_iterator __begin2_9;
  ModuleFieldList *__range2_9;
  Enum local_5c4;
  StartModuleField *local_5c0;
  StartModuleField *f_8;
  ModuleField *field_9;
  intrusive_list<wabt::ModuleField> *local_5a8;
  undefined1 local_5a0 [8];
  const_iterator __end2_8;
  const_iterator __begin2_8;
  ModuleFieldList *__range2_8;
  Var local_568;
  Enum local_51c;
  ExportModuleField *local_518;
  ExportModuleField *f_7;
  ModuleField *field_8;
  intrusive_list<wabt::ModuleField> *local_500;
  undefined1 local_4f8 [8];
  const_iterator __end2_7;
  const_iterator __begin2_7;
  ModuleFieldList *__range2_7;
  Enum local_484;
  TagModuleField *local_480;
  TagModuleField *f_6;
  ModuleField *field_7;
  intrusive_list<wabt::ModuleField> *local_468;
  undefined1 local_460 [8];
  const_iterator __end2_6;
  const_iterator __begin2_6;
  ModuleFieldList *__range2_6;
  undefined1 local_430 [8];
  ExprVisitor visitor;
  GlobalModuleField *f_5;
  ModuleField *field_6;
  const_iterator __end2_5;
  const_iterator __begin2_5;
  ModuleFieldList *__range2_5;
  MemoryModuleField *f_4;
  ModuleField *field_5;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  ModuleFieldList *__range2_4;
  TableModuleField *f_3;
  ModuleField *field_4;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  ModuleFieldList *__range2_3;
  Enum local_274;
  FuncModuleField *local_270;
  FuncModuleField *f_2;
  ModuleField *field_3;
  intrusive_list<wabt::ModuleField> *local_258;
  undefined1 local_250 [8];
  const_iterator __end2_2;
  const_iterator __begin2_2;
  ModuleFieldList *__range2_2;
  Enum local_1dc;
  Tag *local_1d8;
  Tag *tag;
  Enum local_1c4;
  Global *local_1c0;
  Global *global;
  Memory *local_1b0;
  Memory *memory;
  Enum local_19c;
  Table *local_198;
  Table *table;
  Enum local_144;
  Func *local_140;
  Func *func;
  ImportModuleField *f_1;
  ModuleField *field_2;
  intrusive_list<wabt::ModuleField> *local_120;
  undefined1 local_118 [8];
  const_iterator __end2_1;
  const_iterator __begin2_1;
  ModuleFieldList *__range2_1;
  ArrayType *array_type;
  byte local_bc;
  reference local_b8;
  Field *field_1;
  iterator __end5;
  iterator __begin5;
  vector<wabt::Field,_std::allocator<wabt::Field>_> *__range5;
  TypeMutVector type_muts;
  StructType *struct_type;
  FuncType *func_type;
  TypeModuleField *f;
  ModuleField *field;
  const_iterator __end2;
  const_iterator __begin2;
  ModuleFieldList *__range2;
  Module *module;
  Validator *this_local;
  
  this_00 = this->current_module_;
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&this_00->fields);
  cVar36 = intrusive_list<wabt::ModuleField>::end(&this_00->fields);
  while (bVar8 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                           ((const_iterator *)&__end2.node_,cVar36), bVar8) {
    pMVar33 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)&__end2.node_);
    pTVar12 = dyn_cast<wabt::TypeModuleField,wabt::ModuleField>(pMVar33);
    if (pTVar12 != (TypeModuleField *)0x0) {
      pTVar13 = std::unique_ptr<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>::operator->
                          (&pTVar12->type);
      TVar9 = TypeEntry::kind(pTVar13);
      if (TVar9 == Func) {
        pTVar13 = std::unique_ptr<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>::get
                            (&pTVar12->type);
        pFVar14 = cast<wabt::FuncType,wabt::TypeEntry>(pTVar13);
        sVar29 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                           (&(pFVar14->sig).param_types);
        pTVar15 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::data
                            (&(pFVar14->sig).param_types);
        sVar16 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                           (&(pFVar14->sig).result_types);
        result_types = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::data
                                 (&(pFVar14->sig).result_types);
        type_index = Module::GetFuncTypeIndex(this_00,&pFVar14->sig);
        RVar11 = SharedValidator::OnFuncType
                           (&this->validator_,&pMVar33->loc,(Index)sVar29,pTVar15,(Index)sVar16,
                            result_types,type_index);
        Result::operator|=(&this->result_,RVar11);
      }
      else if (TVar9 == Struct) {
        pTVar13 = std::unique_ptr<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>::get
                            (&pTVar12->type);
        type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)cast<wabt::StructType,wabt::TypeEntry>(pTVar13);
        std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::vector
                  ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)&__range5);
        pTVar1 = type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage + 6;
        __end5 = std::vector<wabt::Field,_std::allocator<wabt::Field>_>::begin
                           ((vector<wabt::Field,_std::allocator<wabt::Field>_> *)&pTVar1->mutable_);
        field_1 = (Field *)std::vector<wabt::Field,_std::allocator<wabt::Field>_>::end
                                     ((vector<wabt::Field,_std::allocator<wabt::Field>_> *)
                                      &pTVar1->mutable_);
        while (bVar8 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<wabt::Field_*,_std::vector<wabt::Field,_std::allocator<wabt::Field>_>_>
                                           *)&field_1), bVar8) {
          local_b8 = __gnu_cxx::
                     __normal_iterator<wabt::Field_*,_std::vector<wabt::Field,_std::allocator<wabt::Field>_>_>
                     ::operator*(&__end5);
          unique0x00012000 = local_b8->type;
          local_bc = local_b8->mutable_ & 1;
          std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::push_back
                    ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)&__range5,
                     (value_type *)((long)&array_type + 4));
          __gnu_cxx::
          __normal_iterator<wabt::Field_*,_std::vector<wabt::Field,_std::allocator<wabt::Field>_>_>
          ::operator++(&__end5);
        }
        sVar29 = std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::size
                           ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)&__range5);
        fields = std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::data
                           ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)&__range5);
        array_type._0_4_ =
             SharedValidator::OnStructType(&this->validator_,&pMVar33->loc,(Index)sVar29,fields);
        Result::operator|=(&this->result_,array_type._0_4_);
        std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::~vector
                  ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)&__range5);
      }
      else if (TVar9 == Array) {
        pTVar13 = std::unique_ptr<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>::get
                            (&pTVar12->type);
        pAVar17 = cast<wabt::ArrayType,wabt::TypeEntry>(pTVar13);
        field_13.mutable_ = (bool)((pAVar17->field).mutable_ & 1);
        field_13.type = (pAVar17->field).type;
        field_13._9_3_ = 0;
        RVar11 = SharedValidator::OnArrayType(&this->validator_,&pMVar33->loc,field_13);
        Result::operator|=(&this->result_,RVar11);
      }
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2.node_);
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&this_00->fields);
  _local_118 = intrusive_list<wabt::ModuleField>::end(&this_00->fields);
  while( true ) {
    field_2 = (ModuleField *)local_118;
    local_120 = __end2_1.list_;
    bVar8 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                      ((const_iterator *)&__end2_1.node_,_local_118);
    if (!bVar8) break;
    f_1 = (ImportModuleField *)
          intrusive_list<wabt::ModuleField>::const_iterator::operator*
                    ((const_iterator *)&__end2_1.node_);
    func = (Func *)dyn_cast<wabt::ImportModuleField,wabt::ModuleField>((ModuleField *)f_1);
    if (func != (Func *)0x0) {
      pIVar18 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::operator->
                          ((unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_> *)
                           ((long)&(func->decl).type_var.loc.field_1 + 8));
      EVar10 = Import::kind(pIVar18);
      switch(EVar10) {
      case First:
        pIVar18 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get
                            ((unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_> *)
                             ((long)&(func->decl).type_var.loc.field_1 + 8));
        pFVar19 = cast<wabt::FuncImport,wabt::Import>(pIVar18);
        local_140 = &pFVar19->func;
        pMVar2 = &f_1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>;
        GetFuncTypeIndex((Var *)&table,this,
                         &(f_1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
                          loc,&(pFVar19->func).decl);
        local_144 = (Enum)SharedValidator::OnFunction
                                    (&this->validator_,&(pMVar2->super_ModuleField).loc,
                                     (Var *)&table);
        Result::operator|=(&this->result_,(Result)local_144);
        Var::~Var((Var *)&table);
        break;
      case Table:
        pIVar18 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get
                            ((unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_> *)
                             ((long)&(func->decl).type_var.loc.field_1 + 8));
        pTVar20 = cast<wabt::TableImport,wabt::Import>(pIVar18);
        local_198 = &pTVar20->table;
        unique0x00012000 = (pTVar20->table).elem_type;
        local_19c = (Enum)SharedValidator::OnTable
                                    (&this->validator_,
                                     &(f_1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                                      super_ModuleField.loc,unique0x00012000,
                                     &(pTVar20->table).elem_limits);
        Result::operator|=(&this->result_,(Result)local_19c);
        break;
      case Memory:
        pIVar18 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get
                            ((unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_> *)
                             ((long)&(func->decl).type_var.loc.field_1 + 8));
        pMVar21 = cast<wabt::MemoryImport,wabt::Import>(pIVar18);
        local_1b0 = &pMVar21->memory;
        global._4_4_ = SharedValidator::OnMemory
                                 (&this->validator_,
                                  &(f_1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                                   super_ModuleField.loc,&(pMVar21->memory).page_limits,
                                  (pMVar21->memory).page_size);
        Result::operator|=(&this->result_,global._4_4_);
        break;
      case Global:
        pIVar18 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get
                            ((unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_> *)
                             ((long)&(func->decl).type_var.loc.field_1 + 8));
        pGVar22 = cast<wabt::GlobalImport,wabt::Import>(pIVar18);
        local_1c0 = &pGVar22->global;
        unique0x00012000 = (pGVar22->global).type;
        local_1c4 = (Enum)SharedValidator::OnGlobalImport
                                    (&this->validator_,
                                     &(f_1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                                      super_ModuleField.loc,unique0x00012000,
                                     (bool)((pGVar22->global).mutable_ & 1));
        Result::operator|=(&this->result_,(Result)local_1c4);
        break;
      case Last:
        pIVar18 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get
                            ((unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_> *)
                             ((long)&(func->decl).type_var.loc.field_1 + 8));
        pTVar23 = cast<wabt::TagImport,wabt::Import>(pIVar18);
        local_1d8 = &pTVar23->tag;
        pMVar2 = &f_1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>;
        GetFuncTypeIndex((Var *)&__range2_2,this,
                         &(f_1->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
                          loc,&(pTVar23->tag).decl);
        local_1dc = (Enum)SharedValidator::OnTag
                                    (&this->validator_,&(pMVar2->super_ModuleField).loc,
                                     (Var *)&__range2_2);
        Result::operator|=(&this->result_,(Result)local_1dc);
        Var::~Var((Var *)&__range2_2);
      }
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_1.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&this_00->fields);
  _local_250 = intrusive_list<wabt::ModuleField>::end(&this_00->fields);
  while( true ) {
    field_3 = (ModuleField *)local_250;
    local_258 = __end2_2.list_;
    bVar8 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                      ((const_iterator *)&__end2_2.node_,_local_250);
    if (!bVar8) break;
    f_2 = (FuncModuleField *)
          intrusive_list<wabt::ModuleField>::const_iterator::operator*
                    ((const_iterator *)&__end2_2.node_);
    local_270 = dyn_cast<wabt::FuncModuleField,wabt::ModuleField>((ModuleField *)f_2);
    if (local_270 != (FuncModuleField *)0x0) {
      pMVar3 = &f_2->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>;
      GetFuncTypeIndex((Var *)&__range2_3,this,
                       &(f_2->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.
                        loc,&(local_270->func).decl);
      local_274 = (Enum)SharedValidator::OnFunction
                                  (&this->validator_,&(pMVar3->super_ModuleField).loc,
                                   (Var *)&__range2_3);
      Result::operator|=(&this->result_,(Result)local_274);
      Var::~Var((Var *)&__range2_3);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_2.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&this_00->fields);
  cVar36 = intrusive_list<wabt::ModuleField>::end(&this_00->fields);
  while (bVar8 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                           ((const_iterator *)&__end2_3.node_,cVar36), bVar8) {
    pMVar33 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)&__end2_3.node_);
    pTVar24 = dyn_cast<wabt::TableModuleField,wabt::ModuleField>(pMVar33);
    if (pTVar24 != (TableModuleField *)0x0) {
      RVar11 = SharedValidator::OnTable
                         (&this->validator_,&pMVar33->loc,(pTVar24->table).elem_type,
                          &(pTVar24->table).elem_limits);
      Result::operator|=(&this->result_,RVar11);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_3.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&this_00->fields);
  cVar36 = intrusive_list<wabt::ModuleField>::end(&this_00->fields);
  while (bVar8 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                           ((const_iterator *)&__end2_4.node_,cVar36), bVar8) {
    pMVar33 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)&__end2_4.node_);
    pMVar25 = dyn_cast<wabt::MemoryModuleField,wabt::ModuleField>(pMVar33);
    if (pMVar25 != (MemoryModuleField *)0x0) {
      RVar11 = SharedValidator::OnMemory
                         (&this->validator_,&pMVar33->loc,&(pMVar25->memory).page_limits,
                          (pMVar25->memory).page_size);
      Result::operator|=(&this->result_,RVar11);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_4.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&this_00->fields);
  cVar36 = intrusive_list<wabt::ModuleField>::end(&this_00->fields);
  while (bVar8 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                           ((const_iterator *)&__end2_5.node_,cVar36), bVar8) {
    pMVar33 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)&__end2_5.node_);
    pGVar26 = dyn_cast<wabt::GlobalModuleField,wabt::ModuleField>(pMVar33);
    if (pGVar26 != (GlobalModuleField *)0x0) {
      RVar11 = SharedValidator::OnGlobal
                         (&this->validator_,&pMVar33->loc,(pGVar26->global).type,
                          (bool)((pGVar26->global).mutable_ & 1));
      Result::operator|=(&this->result_,RVar11);
      visitor.catch_index_stack_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)&(pGVar26->global).type;
      RVar11 = SharedValidator::BeginInitExpr
                         (&this->validator_,&pMVar33->loc,
                          (Type)visitor.catch_index_stack_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      Result::operator|=(&this->result_,RVar11);
      ExprVisitor::ExprVisitor((ExprVisitor *)local_430,&this->super_Delegate);
      RVar11 = ExprVisitor::VisitExprList((ExprVisitor *)local_430,&(pGVar26->global).init_expr);
      Result::operator|=(&this->result_,RVar11);
      RVar11 = SharedValidator::EndInitExpr(&this->validator_);
      Result::operator|=(&this->result_,RVar11);
      ExprVisitor::~ExprVisitor((ExprVisitor *)local_430);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_5.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&this_00->fields);
  _local_460 = intrusive_list<wabt::ModuleField>::end(&this_00->fields);
  while( true ) {
    field_7 = (ModuleField *)local_460;
    local_468 = __end2_6.list_;
    bVar8 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                      ((const_iterator *)&__end2_6.node_,_local_460);
    if (!bVar8) break;
    f_6 = (TagModuleField *)
          intrusive_list<wabt::ModuleField>::const_iterator::operator*
                    ((const_iterator *)&__end2_6.node_);
    local_480 = dyn_cast<wabt::TagModuleField,wabt::ModuleField>((ModuleField *)f_6);
    if (local_480 != (TagModuleField *)0x0) {
      pMVar4 = &f_6->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>;
      GetFuncTypeIndex((Var *)&__range2_7,this,
                       &(f_6->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
                        loc,&(local_480->tag).decl);
      local_484 = (Enum)SharedValidator::OnTag
                                  (&this->validator_,&(pMVar4->super_ModuleField).loc,
                                   (Var *)&__range2_7);
      Result::operator|=(&this->result_,(Result)local_484);
      Var::~Var((Var *)&__range2_7);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_6.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&this_00->fields);
  _local_4f8 = intrusive_list<wabt::ModuleField>::end(&this_00->fields);
  while( true ) {
    field_8 = (ModuleField *)local_4f8;
    local_500 = __end2_7.list_;
    bVar8 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                      ((const_iterator *)&__end2_7.node_,_local_4f8);
    if (!bVar8) break;
    f_7 = (ExportModuleField *)
          intrusive_list<wabt::ModuleField>::const_iterator::operator*
                    ((const_iterator *)&__end2_7.node_);
    local_518 = dyn_cast<wabt::ExportModuleField,wabt::ModuleField>((ModuleField *)f_7);
    if (local_518 != (ExportModuleField *)0x0) {
      pMVar5 = &f_7->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>;
      EVar10 = (local_518->export_).kind;
      Var::Var(&local_568,&(local_518->export_).var);
      name = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_518->export_)
      ;
      local_51c = (Enum)SharedValidator::OnExport
                                  (&this->validator_,&(pMVar5->super_ModuleField).loc,EVar10,
                                   &local_568,name);
      Result::operator|=(&this->result_,(Result)local_51c);
      Var::~Var(&local_568);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_7.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&this_00->fields);
  _local_5a0 = intrusive_list<wabt::ModuleField>::end(&this_00->fields);
  while( true ) {
    field_9 = (ModuleField *)local_5a0;
    local_5a8 = __end2_8.list_;
    bVar8 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                      ((const_iterator *)&__end2_8.node_,_local_5a0);
    if (!bVar8) break;
    f_8 = (StartModuleField *)
          intrusive_list<wabt::ModuleField>::const_iterator::operator*
                    ((const_iterator *)&__end2_8.node_);
    local_5c0 = dyn_cast<wabt::StartModuleField,wabt::ModuleField>((ModuleField *)f_8);
    if (local_5c0 != (StartModuleField *)0x0) {
      pMVar6 = &f_8->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>;
      Var::Var((Var *)&__range2_9,&local_5c0->start);
      local_5c4 = (Enum)SharedValidator::OnStart
                                  (&this->validator_,&(pMVar6->super_ModuleField).loc,
                                   (Var *)&__range2_9);
      Result::operator|=(&this->result_,(Result)local_5c4);
      Var::~Var((Var *)&__range2_9);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_8.node_)
    ;
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&this_00->fields);
  _local_638 = intrusive_list<wabt::ModuleField>::end(&this_00->fields);
  while( true ) {
    field_10 = (ModuleField *)local_638;
    local_640 = __end2_9.list_;
    bVar8 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                      ((const_iterator *)&__end2_9.node_,_local_638);
    if (!bVar8) break;
    f_9 = (ElemSegmentModuleField *)
          intrusive_list<wabt::ModuleField>::const_iterator::operator*
                    ((const_iterator *)&__end2_9.node_);
    local_658 = dyn_cast<wabt::ElemSegmentModuleField,wabt::ModuleField>((ModuleField *)f_9);
    if (local_658 != (ElemSegmentModuleField *)0x0) {
      pMVar7 = &f_9->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>;
      Var::Var(&local_6a8,&(local_658->elem_segment).table_var);
      local_65c = (Enum)SharedValidator::OnElemSegment
                                  (&this->validator_,&(pMVar7->super_ModuleField).loc,&local_6a8,
                                   (local_658->elem_segment).kind);
      Result::operator|=(&this->result_,(Result)local_65c);
      Var::~Var(&local_6a8);
      offset_type = (local_658->elem_segment).elem_type;
      RVar11 = SharedValidator::OnElemSegmentElemType
                         (&this->validator_,
                          &(f_9->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField
                           .loc,offset_type);
      Result::operator|=(&this->result_,RVar11);
      if ((local_658->elem_segment).kind == Active) {
        Type::Type(&stack0xfffffffffffff944,I32);
        local_6c0 = Module::GetTableIndex(this_00,&(local_658->elem_segment).table_var);
        uVar27 = (ulong)local_6c0;
        sVar29 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size(&this_00->tables);
        if ((uVar27 < sVar29) &&
           (ppTVar28 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::operator[]
                                 (&this_00->tables,(ulong)local_6c0),
           (((*ppTVar28)->elem_limits).is_64 & 1U) != 0)) {
          Type::Type(&local_6c8,I64);
          TStack_6bc = local_6c8;
        }
        stack0xfffffffffffff92c = TStack_6bc;
        RVar11 = SharedValidator::BeginInitExpr
                           (&this->validator_,
                            &(f_9->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).
                             super_ModuleField.loc,TStack_6bc);
        Result::operator|=(&this->result_,RVar11);
        ExprVisitor::ExprVisitor((ExprVisitor *)local_740,&this->super_Delegate);
        RVar11 = ExprVisitor::VisitExprList
                           ((ExprVisitor *)local_740,&(local_658->elem_segment).offset);
        Result::operator|=(&this->result_,RVar11);
        RVar11 = SharedValidator::EndInitExpr(&this->validator_);
        Result::operator|=(&this->result_,RVar11);
        ExprVisitor::~ExprVisitor((ExprVisitor *)local_740);
      }
      this_01 = &(local_658->elem_segment).elem_exprs;
      __end4 = std::
               vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
               ::begin(this_01);
      elem_expr = (intrusive_list<wabt::Expr> *)
                  std::
                  vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                  ::end(this_01);
      while (bVar8 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
                                         *)&elem_expr), bVar8) {
        this_02 = __gnu_cxx::
                  __normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
                  ::operator*(&__end4);
        pvVar31 = intrusive_list<wabt::Expr>::front(this_02);
        unique0x00012000 = (local_658->elem_segment).elem_type;
        RVar11 = SharedValidator::BeginInitExpr(&this->validator_,&pvVar31->loc,unique0x00012000);
        Result::operator|=(&this->result_,RVar11);
        ExprVisitor::ExprVisitor((ExprVisitor *)local_7e0,&this->super_Delegate);
        RVar11 = ExprVisitor::VisitExprList((ExprVisitor *)local_7e0,this_02);
        Result::operator|=(&this->result_,RVar11);
        RVar11 = SharedValidator::EndInitExpr(&this->validator_);
        Result::operator|=(&this->result_,RVar11);
        ExprVisitor::~ExprVisitor((ExprVisitor *)local_7e0);
        __gnu_cxx::
        __normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
        ::operator++(&__end4);
      }
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2_9.node_)
    ;
  }
  sVar29 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::size
                     (&this_00->data_segments);
  SharedValidator::OnDataCount(&this->validator_,(Index)sVar29);
  __range2_10._4_4_ = this_00->num_func_imports;
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&this_00->fields);
  cVar36 = intrusive_list<wabt::ModuleField>::end(&this_00->fields);
  while (bVar8 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                           ((const_iterator *)&__end2_10.node_,cVar36), bVar8) {
    pMVar33 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)&__end2_10.node_);
    pFVar30 = dyn_cast<wabt::FuncModuleField,wabt::ModuleField>(pMVar33);
    if (pFVar30 != (FuncModuleField *)0x0) {
      loc = &(pFVar30->func).loc;
      bVar8 = intrusive_list<wabt::Expr>::empty(&(pFVar30->func).exprs);
      local_b18 = loc;
      if (!bVar8) {
        pvVar31 = intrusive_list<wabt::Expr>::back(&(pFVar30->func).exprs);
        local_b18 = &pvVar31->loc;
      }
      RVar11 = SharedValidator::BeginFunctionBody(&this->validator_,loc,__range2_10._4_4_);
      Result::operator|=(&this->result_,RVar11);
      this_03 = LocalTypes::decls(&(pFVar30->func).local_types);
      __end4_1 = std::
                 vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                 ::begin(this_03);
      decl = (pair<wabt::Type,_unsigned_int> *)
             std::
             vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
             ::end(this_03);
      while (bVar8 = __gnu_cxx::operator!=
                               (&__end4_1,
                                (__normal_iterator<const_std::pair<wabt::Type,_unsigned_int>_*,_std::vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>_>
                                 *)&decl), bVar8) {
        ppVar32 = __gnu_cxx::
                  __normal_iterator<const_std::pair<wabt::Type,_unsigned_int>_*,_std::vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>_>
                  ::operator*(&__end4_1);
        unique0x00012000 = ppVar32->first;
        RVar11 = SharedValidator::OnLocalDecl
                           (&this->validator_,loc,ppVar32->second,unique0x00012000);
        Result::operator|=(&this->result_,RVar11);
        __gnu_cxx::
        __normal_iterator<const_std::pair<wabt::Type,_unsigned_int>_*,_std::vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>_>
        ::operator++(&__end4_1);
      }
      ExprVisitor::ExprVisitor((ExprVisitor *)local_8e8,&this->super_Delegate);
      RVar11 = ExprVisitor::VisitExprList((ExprVisitor *)local_8e8,&(pFVar30->func).exprs);
      Result::operator|=(&this->result_,RVar11);
      RVar11 = SharedValidator::EndFunctionBody(&this->validator_,local_b18);
      Result::operator|=(&this->result_,RVar11);
      ExprVisitor::~ExprVisitor((ExprVisitor *)local_8e8);
      __range2_10._4_4_ = __range2_10._4_4_ + 1;
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++
              ((const_iterator *)&__end2_10.node_);
  }
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&this_00->fields);
  cVar36 = intrusive_list<wabt::ModuleField>::end(&this_00->fields);
  while (bVar8 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                           ((const_iterator *)&__end2_11.node_,cVar36), bVar8) {
    pMVar33 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)&__end2_11.node_);
    pDVar34 = dyn_cast<wabt::DataSegmentModuleField,wabt::ModuleField>(pMVar33);
    if (pDVar34 != (DataSegmentModuleField *)0x0) {
      Var::Var((Var *)&offset_type_1,&(pDVar34->data_segment).memory_var);
      RVar11 = SharedValidator::OnDataSegment
                         (&this->validator_,&pMVar33->loc,(Var *)&offset_type_1,
                          (pDVar34->data_segment).kind);
      Result::operator|=(&this->result_,RVar11);
      Var::~Var((Var *)&offset_type_1);
      if ((pDVar34->data_segment).kind == Active) {
        Type::Type(&stack0xfffffffffffff670,I32);
        local_994 = Module::GetMemoryIndex(this_00,&(pDVar34->data_segment).memory_var);
        uVar27 = (ulong)local_994;
        sVar29 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::size
                           (&this_00->memories);
        if ((uVar27 < sVar29) &&
           (ppMVar35 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::operator[]
                                 (&this_00->memories,(ulong)local_994),
           (((*ppMVar35)->page_limits).is_64 & 1U) != 0)) {
          Type::Type(&local_99c,I64);
          TStack_990 = local_99c;
        }
        visitor_4.catch_index_stack_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)TStack_990;
        RVar11 = SharedValidator::BeginInitExpr(&this->validator_,&pMVar33->loc,TStack_990);
        Result::operator|=(&this->result_,RVar11);
        ExprVisitor::ExprVisitor((ExprVisitor *)local_a10,&this->super_Delegate);
        RVar11 = ExprVisitor::VisitExprList
                           ((ExprVisitor *)local_a10,&(pDVar34->data_segment).offset);
        Result::operator|=(&this->result_,RVar11);
        RVar11 = SharedValidator::EndInitExpr(&this->validator_);
        Result::operator|=(&this->result_,RVar11);
        ExprVisitor::~ExprVisitor((ExprVisitor *)local_a10);
      }
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++
              ((const_iterator *)&__end2_11.node_);
  }
  RVar11 = SharedValidator::EndModule(&this->validator_);
  Result::operator|=(&this->result_,RVar11);
  return (Result)(this->result_).enum_;
}

Assistant:

Result Validator::CheckModule() {
  const Module* module = current_module_;

  // Type section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TypeModuleField>(&field)) {
      switch (f->type->kind()) {
        case TypeEntryKind::Func: {
          FuncType* func_type = cast<FuncType>(f->type.get());
          result_ |= validator_.OnFuncType(
              field.loc, func_type->sig.param_types.size(),
              func_type->sig.param_types.data(),
              func_type->sig.result_types.size(),
              func_type->sig.result_types.data(),
              module->GetFuncTypeIndex(func_type->sig));
          break;
        }

        case TypeEntryKind::Struct: {
          StructType* struct_type = cast<StructType>(f->type.get());
          TypeMutVector type_muts;
          for (auto&& field : struct_type->fields) {
            type_muts.push_back(TypeMut{field.type, field.mutable_});
          }
          result_ |= validator_.OnStructType(field.loc, type_muts.size(),
                                             type_muts.data());
          break;
        }

        case TypeEntryKind::Array: {
          ArrayType* array_type = cast<ArrayType>(f->type.get());
          result_ |= validator_.OnArrayType(
              field.loc,
              TypeMut{array_type->field.type, array_type->field.mutable_});
          break;
        }
      }
    }
  }

  // Import section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ImportModuleField>(&field)) {
      switch (f->import->kind()) {
        case ExternalKind::Func: {
          auto&& func = cast<FuncImport>(f->import.get())->func;
          result_ |= validator_.OnFunction(
              field.loc, GetFuncTypeIndex(field.loc, func.decl));
          break;
        }

        case ExternalKind::Table: {
          auto&& table = cast<TableImport>(f->import.get())->table;
          result_ |=
              validator_.OnTable(field.loc, table.elem_type, table.elem_limits);
          break;
        }

        case ExternalKind::Memory: {
          auto&& memory = cast<MemoryImport>(f->import.get())->memory;
          result_ |= validator_.OnMemory(field.loc, memory.page_limits,
                                         memory.page_size);
          break;
        }

        case ExternalKind::Global: {
          auto&& global = cast<GlobalImport>(f->import.get())->global;
          result_ |= validator_.OnGlobalImport(field.loc, global.type,
                                               global.mutable_);
          break;
        }

        case ExternalKind::Tag: {
          auto&& tag = cast<TagImport>(f->import.get())->tag;
          result_ |= validator_.OnTag(field.loc,
                                      GetFuncTypeIndex(field.loc, tag.decl));
          break;
        }
      }
    }
  }

  // Func section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      result_ |= validator_.OnFunction(
          field.loc, GetFuncTypeIndex(field.loc, f->func.decl));
    }
  }

  // Table section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TableModuleField>(&field)) {
      result_ |= validator_.OnTable(field.loc, f->table.elem_type,
                                    f->table.elem_limits);
    }
  }

  // Memory section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<MemoryModuleField>(&field)) {
      result_ |= validator_.OnMemory(field.loc, f->memory.page_limits,
                                     f->memory.page_size);
    }
  }

  // Global section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<GlobalModuleField>(&field)) {
      result_ |=
          validator_.OnGlobal(field.loc, f->global.type, f->global.mutable_);

      // Init expr.
      result_ |= validator_.BeginInitExpr(field.loc, f->global.type);
      ExprVisitor visitor(this);
      result_ |=
          visitor.VisitExprList(const_cast<ExprList&>(f->global.init_expr));
      result_ |= validator_.EndInitExpr();
    }
  }

  // Tag section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TagModuleField>(&field)) {
      result_ |=
          validator_.OnTag(field.loc, GetFuncTypeIndex(field.loc, f->tag.decl));
    }
  }

  // Export section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ExportModuleField>(&field)) {
      result_ |= validator_.OnExport(field.loc, f->export_.kind, f->export_.var,
                                     f->export_.name);
    }
  }

  // Start section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<StartModuleField>(&field)) {
      result_ |= validator_.OnStart(field.loc, f->start);
    }
  }

  // Elem segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ElemSegmentModuleField>(&field)) {
      result_ |= validator_.OnElemSegment(field.loc, f->elem_segment.table_var,
                                          f->elem_segment.kind);

      result_ |= validator_.OnElemSegmentElemType(field.loc,
                                                  f->elem_segment.elem_type);

      // Init expr.
      if (f->elem_segment.kind == SegmentKind::Active) {
        Type offset_type = Type::I32;
        Index table_index = module->GetTableIndex(f->elem_segment.table_var);
        if (table_index < module->tables.size() &&
            module->tables[table_index]->elem_limits.is_64) {
          offset_type = Type::I64;
        }
        result_ |= validator_.BeginInitExpr(field.loc, offset_type);
        ExprVisitor visitor(this);
        result_ |= visitor.VisitExprList(
            const_cast<ExprList&>(f->elem_segment.offset));
        result_ |= validator_.EndInitExpr();
      }

      // Element expr.
      for (auto&& elem_expr : f->elem_segment.elem_exprs) {
        result_ |= validator_.BeginInitExpr(elem_expr.front().loc,
                                            f->elem_segment.elem_type);
        ExprVisitor visitor(this);
        result_ |= visitor.VisitExprList(const_cast<ExprList&>(elem_expr));
        result_ |= validator_.EndInitExpr();
      }
    }
  }

  // DataCount section.
  validator_.OnDataCount(module->data_segments.size());

  // Code section.
  Index func_index = module->num_func_imports;
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      const Location& body_start = f->func.loc;
      const Location& body_end =
          f->func.exprs.empty() ? body_start : f->func.exprs.back().loc;
      result_ |= validator_.BeginFunctionBody(body_start, func_index++);

      for (auto&& decl : f->func.local_types.decls()) {
        result_ |= validator_.OnLocalDecl(body_start, decl.second, decl.first);
      }

      ExprVisitor visitor(this);
      result_ |= visitor.VisitExprList(const_cast<ExprList&>(f->func.exprs));
      result_ |= validator_.EndFunctionBody(body_end);
    }
  }

  // Data segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<DataSegmentModuleField>(&field)) {
      result_ |= validator_.OnDataSegment(field.loc, f->data_segment.memory_var,
                                          f->data_segment.kind);

      // Init expr.
      if (f->data_segment.kind == SegmentKind::Active) {
        Type offset_type = Type::I32;
        Index memory_index = module->GetMemoryIndex(f->data_segment.memory_var);
        if (memory_index < module->memories.size() &&
            module->memories[memory_index]->page_limits.is_64) {
          offset_type = Type::I64;
        }
        result_ |= validator_.BeginInitExpr(field.loc, offset_type);
        ExprVisitor visitor(this);
        result_ |= visitor.VisitExprList(
            const_cast<ExprList&>(f->data_segment.offset));
        result_ |= validator_.EndInitExpr();
      }
    }
  }

  result_ |= validator_.EndModule();

  return result_;
}